

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O0

void __thiscall tst_RootIndexProxyModel::replaceModel_data(tst_RootIndexProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  QModelIndex local_f8;
  undefined1 local_e0 [24];
  QModelIndex local_c8;
  QModelIndex local_b0;
  QModelIndex local_98;
  QModelIndex local_80;
  QModelIndex local_68;
  QModelIndex local_50;
  QModelIndex local_38;
  QAbstractItemModel *local_20;
  QAbstractItemModel *replaceModel;
  QAbstractItemModel *baseModel;
  tst_RootIndexProxyModel *this_local;
  
  baseModel = (QAbstractItemModel *)this;
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QModelIndex>("baseRoot",(QModelIndex *)0x0);
  QTest::addColumn<QAbstractItemModel*>("replaceModel",(QAbstractItemModel **)0x0);
  QTest::addColumn<QModelIndex>("replaceRoot",(QModelIndex *)0x0);
  replaceModel = createTreeModel(&this->super_QObject);
  local_20 = createTreeModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("Child");
  pQVar2 = operator<<(pQVar2,&replaceModel);
  pQVar1 = replaceModel;
  QModelIndex::QModelIndex(&local_50);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_38,pQVar1,1,0,&local_50);
  pQVar2 = operator<<(pQVar2,&local_38);
  pQVar2 = operator<<(pQVar2,&local_20);
  pQVar1 = local_20;
  QModelIndex::QModelIndex(&local_80);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_68,pQVar1,0,0,&local_80);
  operator<<(pQVar2,&local_68);
  replaceModel = createTreeModel(&this->super_QObject);
  local_20 = createTreeModel(&this->super_QObject);
  pQVar2 = (QTestData *)QTest::newRow("Grandchild");
  pQVar2 = operator<<(pQVar2,&replaceModel);
  pQVar1 = replaceModel;
  QModelIndex::QModelIndex(&local_b0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_98,pQVar1,1,0,&local_b0);
  pQVar2 = operator<<(pQVar2,&local_98);
  pQVar2 = operator<<(pQVar2,&local_20);
  pQVar1 = local_20;
  QModelIndex::QModelIndex(&local_f8);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_e0,pQVar1,1,0,&local_f8);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_c8,pQVar1,2,0,local_e0);
  operator<<(pQVar2,&local_c8);
  return;
}

Assistant:

void tst_RootIndexProxyModel::replaceModel_data()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndex>("baseRoot");
    QTest::addColumn<QAbstractItemModel *>("replaceModel");
    QTest::addColumn<QModelIndex>("replaceRoot");

    QAbstractItemModel *baseModel = createTreeModel(this);
    QAbstractItemModel *replaceModel = createTreeModel(this);
    QTest::newRow("Child") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(0, 0);
    baseModel = createTreeModel(this);
    replaceModel = createTreeModel(this);
    QTest::newRow("Grandchild") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(2, 0, replaceModel->index(1, 0));
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}